

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_ConvertToGrayScale(ConvertToGrayScaleForm1 ConvertToGrayScale)

{
  byte bVar1;
  const_reference pvVar2;
  code *in_RDI;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff3c;
  uint8_t value;
  Image *image;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t width_;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar4;
  undefined1 local_a8 [7];
  uint8_t in_stack_ffffffffffffff5f;
  undefined1 local_48 [40];
  code *local_8;
  
  image = (Image *)&stack0xffffffffffffffe0;
  uVar3 = 1;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff3c);
  value = (uint8_t)(in_stack_ffffffffffffff3c >> 0x18);
  width_ = 0;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,0);
  uVar4 = CONCAT13(*pvVar2,(int3)in_stack_ffffffffffffff54);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar4,uVar3),width_,in_stack_ffffffffffffff48,
             (uint8_t)((ulong)image >> 0x38),(uint8_t)((ulong)image >> 0x30));
  Test_Helper::uniformRGBImage(in_stack_ffffffffffffff5f,(Image *)CONCAT44(uVar4,uVar3));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d0ee1);
  (*local_8)(local_a8,local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0,0);
  bVar1 = Unit_Test::verifyImage(image,value);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d0f28);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d0f35);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar4,uVar3));
  return (bool)(bVar1 & 1);
}

Assistant:

bool form1_ConvertToGrayScale(ConvertToGrayScaleForm1 ConvertToGrayScale)
    {
        const std::vector < uint8_t > intensity = intensityArray( 1 );
        const PenguinV_Image::Image input = uniformRGBImage( intensity[0] );

        const PenguinV_Image::Image output = ConvertToGrayScale( input );

        return verifyImage( output, intensity[0] );
    }